

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSharedForward.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **argv_local;
  int argc_local;
  
  iVar1 = cmsys_shared_forward_to_real(argc,argv);
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
  return cmsys_shared_forward_to_real(argc, argv);
}